

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O2

bool __thiscall CPubKey::Decompress(CPubKey *this)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  size_t sStack_d0;
  size_t publen;
  uchar pub [65];
  secp256k1_pubkey pubkey;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) == 2) {
    sStack_d0 = 0x21;
  }
  else {
    bVar5 = false;
    if ((7 < bVar1) || (uVar3 = (uint)bVar1, (0xd0U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_00688d22;
    if ((uVar3 < 8) && ((0xd0U >> (uVar3 & 0x1f) & 1) != 0)) {
      sStack_d0 = 0x41;
    }
    else {
      sStack_d0 = 0;
    }
  }
  iVar4 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&pubkey,this->vch,sStack_d0);
  bVar5 = iVar4 != 0;
  if (bVar5) {
    publen = 0x41;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static,pub,&publen,&pubkey,2);
    Set<unsigned_char*>(this,pub,pub + publen);
  }
LAB_00688d22:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool CPubKey::Decompress() {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    unsigned char pub[SIZE];
    size_t publen = SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, SECP256K1_EC_UNCOMPRESSED);
    Set(pub, pub + publen);
    return true;
}